

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O3

int __thiscall
deqp::gls::BufferTestUtil::VertexArrayVerifier::verify
          (VertexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  long *plVar1;
  ulong uVar2;
  GLuint program;
  RenderContext *context;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  RGBA RVar7;
  RGBA RVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uchar *puVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined4 extraout_var;
  undefined8 *puVar18;
  TextureFormat *pTVar19;
  TextureFormat TVar20;
  unsigned_short uVar21;
  int iVar22;
  int iVar23;
  byte bVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  void *pvVar31;
  int y;
  int x;
  CallLogWrapper *this_00;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  Vec4 v10;
  Vec4 v00;
  Vec4 v01;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  string imageSetDesc;
  Vec4 v11;
  RGBA threshold;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  Vec4 color;
  Surface reference;
  Surface rendered;
  PixelBufferAccess dstAccess;
  undefined8 local_348;
  undefined8 uStack_340;
  long local_338;
  undefined8 uStack_330;
  ulong local_320;
  TextureFormat local_318;
  TextureFormat TStack_310;
  ulong local_308;
  TextureFormat TStack_300;
  undefined8 local_2f8;
  float fStack_2f0;
  float fStack_2ec;
  ulong local_2e8 [2];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_2d8;
  long *local_2c0;
  undefined8 local_2b8;
  long local_2b0;
  undefined8 uStack_2a8;
  uchar *local_2a0;
  ulong local_298;
  TextureFormat local_290;
  long lStack_288;
  ulong local_280 [2];
  int local_26c;
  uint local_268;
  int local_264;
  int local_260;
  RGBA local_25c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_258;
  Vec4 local_238;
  ulong local_228 [2];
  uchar *local_218;
  size_t local_210;
  ulong local_208;
  ulong local_200;
  Surface local_1f8;
  Surface local_1e0;
  CallLogWrapper *local_1c8;
  ulong local_1c0;
  uchar *local_1b8;
  ulong local_1b0;
  PixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  int *piVar17;
  
  local_2a0 = tbs;
  local_218 = sig;
  local_210 = siglen;
  iVar14 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[4])();
  piVar17 = (int *)CONCAT44(extraout_var,iVar14);
  iVar14 = *piVar17;
  iVar22 = iVar14 + 7;
  if (-1 < iVar14) {
    iVar22 = iVar14;
  }
  iVar26 = piVar17[1];
  uVar16 = iVar22 >> 3;
  if (0x7f < iVar22 >> 3) {
    uVar16 = 0x80;
  }
  local_320 = (ulong)uVar16;
  iVar22 = iVar26 + 7;
  if (-1 < iVar26) {
    iVar22 = iVar26;
  }
  uVar16 = iVar22 >> 3;
  if (0x7f < iVar22 >> 3) {
    uVar16 = 0x80;
  }
  bVar24 = 8 - (char)piVar17[2];
  uVar15 = 0x1000000 << (8U - (char)piVar17[5] & 0x1f);
  if (piVar17[5] < 1) {
    uVar15 = 0;
  }
  uVar30 = 0x100 << (8U - (char)piVar17[3] & 0x1f) | 1 << (bVar24 & 0x1f);
  uVar15 = 0x10000 << (8U - (char)piVar17[4] & 0x1f) | uVar30 | uVar15;
  uVar29 = 1 << (bVar24 & 0x1f) & 0xff;
  if (0xfb < uVar29) {
    uVar29 = 0xfc;
  }
  program = (this->m_program->m_program).m_program;
  uVar30 = uVar30 >> 8 & 0xff;
  if (0xfb < uVar30) {
    uVar30 = 0xfc;
  }
  uVar25 = uVar15 >> 0x10 & 0xff;
  if (0xfb < uVar25) {
    uVar25 = 0xfc;
  }
  uVar15 = uVar15 >> 0x18;
  if (0xfb < uVar15) {
    uVar15 = 0xfc;
  }
  local_25c.m_value = uVar15 * 0x1000000 + (uVar25 << 0x10 | uVar30 << 8 | uVar29) + 0x3030303;
  local_2d8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tcu::Surface::Surface(&local_1e0);
  tcu::Surface::Surface(&local_1f8);
  uVar15 = uVar16 * (int)local_320;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_2d8,(long)(int)(uVar15 * 4));
  if (7 < iVar26) {
    fVar32 = (float)(int)local_320;
    uVar29 = 0;
    do {
      if (7 < iVar14) {
        fVar33 = (float)(int)uVar29 / (float)(int)uVar16;
        fVar35 = (float)(int)(uVar29 + 1) / (float)(int)uVar16;
        fVar33 = fVar33 + fVar33 + -1.0;
        fVar35 = fVar35 + fVar35 + -1.0;
        iVar22 = uVar29 * (int)local_320 * 4;
        uVar28 = 0;
        do {
          iVar26 = (int)uVar28;
          uVar28 = uVar28 + 1;
          fVar37 = (float)iVar26 / fVar32;
          fVar36 = (float)(int)uVar28 / fVar32;
          fVar37 = fVar37 + fVar37 + -1.0;
          fVar36 = fVar36 + fVar36 + -1.0;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22].m_data[0] = fVar37;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22].m_data[1] = fVar33;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + 1].m_data[0] = fVar37;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + 1].m_data[1] = fVar35;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + 2].m_data[0] = fVar36;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + 2].m_data[1] = fVar33;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + 3].m_data[0] = fVar36;
          local_2d8.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar22 + 3].m_data[1] = fVar35;
          iVar22 = iVar22 + 4;
        } while ((local_320 & 0xffffffff) != uVar28);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != uVar16);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&local_258,(long)(int)(uVar15 * 6));
  if (0 < (int)uVar15) {
    uVar21 = 3;
    lVar27 = 0;
    do {
      iVar14 = (int)lVar27;
      local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar14] = uVar21 - 1;
      local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar14 + 1] = uVar21 - 3;
      local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar14 + 2] = uVar21 - 2;
      local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar14 + 3] = uVar21 - 1;
      local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar14 + 4] = uVar21 - 2;
      local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar14 + 5] = uVar21;
      lVar27 = lVar27 + 6;
      uVar21 = uVar21 + 4;
    } while ((ulong)uVar15 * 6 != lVar27);
  }
  this_00 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x88eb,0);
  glu::CallLogWrapper::glViewport(this_00,0,0,(int)local_320 * 8,uVar16 << 3);
  glu::CallLogWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_positionBuf);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8892,
             (long)local_2d8.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2d8.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             local_2d8.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_posLoc);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,this->m_posLoc,2,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_indexBuf);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8893,
             (long)local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_byteVecLoc);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(GLuint)ctx);
  local_268 = uVar15 * 0xc;
  local_26c = (int)local_2a0 + -0xc;
  local_218 = local_218 + (int)local_210;
  iVar14 = 0;
  local_1c8 = this_00;
  do {
    iVar22 = iVar14;
    uVar16 = (int)local_2a0 - iVar22;
    if (uVar16 == 0 || (int)local_2a0 < iVar22) break;
    uVar15 = 0xc;
    iVar14 = local_26c;
    if ((0xb < (int)uVar16) &&
       (uVar29 = uVar16 / 0xc, uVar15 = uVar29 * 0xc, iVar14 = iVar22, uVar16 = uVar15,
       SBORROW4(local_268,uVar15) != (int)(local_268 + uVar29 * -0xc) < 0)) {
      uVar15 = local_268;
      uVar16 = local_268;
    }
    local_208 = (ulong)uVar16;
    uVar16 = (int)uVar15 / 0xc;
    iVar26 = (int)local_320;
    local_200 = (ulong)uVar16;
    if (iVar26 < (int)uVar16) {
      local_200 = local_320 & 0xffffffff;
    }
    local_260 = ((int)uVar16 / iVar26 + 1) - (uint)((int)uVar16 % iVar26 == 0);
    local_2f8 = local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Bytes ","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    iVar26 = iVar14 + (int)local_210;
    std::ostream::operator<<((ostringstream *)local_1a8,iVar26);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar28 = 0xf;
    if (local_2f8 != local_2e8) {
      uVar28 = local_2e8[0];
    }
    uVar2 = lStack_288 + CONCAT44(fStack_2ec,fStack_2f0);
    if (uVar28 < uVar2) {
      uVar28 = 0xf;
      if ((ulong *)CONCAT44(local_290.type,local_290.order) != local_280) {
        uVar28 = local_280[0];
      }
      if (uVar28 < uVar2) goto LAB_0096b4cf;
      puVar18 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2f8);
    }
    else {
LAB_0096b4cf:
      puVar18 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_2f8,CONCAT44(local_290.type,local_290.order));
    }
    local_348 = &local_338;
    plVar1 = puVar18 + 2;
    if ((long *)*puVar18 == plVar1) {
      local_338 = *plVar1;
      uStack_330 = puVar18[3];
    }
    else {
      local_338 = *plVar1;
      local_348 = (long *)*puVar18;
    }
    uStack_340 = puVar18[1];
    *puVar18 = plVar1;
    puVar18[1] = 0;
    *(undefined1 *)plVar1 = 0;
    pTVar19 = (TextureFormat *)std::__cxx11::string::append((char *)&local_348);
    local_318 = (TextureFormat)&local_308;
    TVar20 = (TextureFormat)(pTVar19 + 2);
    if (*pTVar19 == TVar20) {
      local_308 = *(ulong *)TVar20;
      TStack_300 = pTVar19[3];
    }
    else {
      local_308 = *(ulong *)TVar20;
      local_318 = *pTVar19;
    }
    TStack_310 = pTVar19[1];
    *pTVar19 = TVar20;
    pTVar19[1].order = R;
    pTVar19[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar19[2].order = R;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<((ostringstream *)local_1a8,iVar26 + uVar15 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar28 = 0xf;
    if (local_318 != (TextureFormat)&local_308) {
      uVar28 = local_308;
    }
    uVar2 = CONCAT44(local_238.m_data[3],local_238.m_data[2]) + (long)TStack_310;
    if (uVar28 < uVar2) {
      uVar28 = 0xf;
      if ((ulong *)CONCAT44(local_238.m_data[1],local_238.m_data[0]) != local_228) {
        uVar28 = local_228[0];
      }
      if (uVar28 < uVar2) goto LAB_0096b638;
      puVar18 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_318);
    }
    else {
LAB_0096b638:
      puVar18 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_318,CONCAT44(local_238.m_data[1],local_238.m_data[0]));
    }
    local_2c0 = &local_2b0;
    plVar1 = puVar18 + 2;
    if ((long *)*puVar18 == plVar1) {
      local_2b0 = *plVar1;
      uStack_2a8 = puVar18[3];
    }
    else {
      local_2b0 = *plVar1;
      local_2c0 = (long *)*puVar18;
    }
    local_2b8 = puVar18[1];
    *puVar18 = plVar1;
    puVar18[1] = 0;
    *(undefined1 *)plVar1 = 0;
    if ((ulong *)CONCAT44(local_238.m_data[1],local_238.m_data[0]) != local_228) {
      operator_delete((ulong *)CONCAT44(local_238.m_data[1],local_238.m_data[0]),local_228[0] + 1);
    }
    if (local_318 != (TextureFormat)&local_308) {
      operator_delete((void *)local_318,local_308 + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if ((ulong *)CONCAT44(local_290.type,local_290.order) != local_280) {
      operator_delete((ulong *)CONCAT44(local_290.type,local_290.order),local_280[0] + 1);
    }
    if (local_2f8 != local_2e8) {
      operator_delete(local_2f8,local_2e8[0] + 1);
    }
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,this->m_byteVecLoc,3,0x1401,'\x01',0,(void *)(long)iVar26);
    glu::CallLogWrapper::glDrawElements(this_00,4,uVar16 * 6,0x1403,(void *)0x0);
    iVar26 = (int)local_200;
    iVar23 = iVar26 * 8;
    tcu::Surface::setSize
              (&local_1f8,iVar23,
               (((int)uVar16 / iVar26 + 1) - (uint)((int)uVar16 % iVar26 == 0)) * 8);
    local_318.order = RGBA;
    local_318.type = UNORM_INT8;
    pvVar31 = (void *)local_1f8.m_pixels.m_cap;
    if ((void *)local_1f8.m_pixels.m_cap != (void *)0x0) {
      pvVar31 = local_1f8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (local_1a8,&local_318,local_1f8.m_width,local_1f8.m_height,1,pvVar31);
    local_318.order = R;
    local_318.type = SNORM_INT8;
    TStack_310.order = R;
    TStack_310.type = 0xff;
    tcu::clear(local_1a8,(IVec4 *)&local_318);
    local_264 = iVar23;
    if (0xb < (int)uVar15) {
      local_1b8 = local_218 + iVar14;
      local_1c0 = (ulong)uVar16;
      uVar28 = 0;
      do {
        puVar12 = local_1b8;
        lVar27 = (long)(int)local_200;
        uVar2 = (ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff;
        local_298 = (long)uVar2 / lVar27 & 0xffffffff;
        iVar14 = (int)uVar28 * 0xc;
        local_348 = (long *)(CONCAT44(local_348._4_4_,
                                      (uint)CONCAT12(local_1b8[(long)iVar14 + 2],
                                                     *(undefined2 *)(local_1b8 + iVar14))) |
                            0xff000000);
        local_1b0 = uVar28;
        tcu::RGBA::toVec((RGBA *)&local_348);
        local_2f8 = (ulong *)(CONCAT44(local_2f8._4_4_,
                                       (uint)CONCAT12(puVar12[(long)iVar14 + 5],
                                                      *(undefined2 *)(puVar12 + (long)iVar14 + 3)))
                             | 0xff000000);
        tcu::RGBA::toVec((RGBA *)&local_2f8);
        local_290.order =
             CONCAT12(puVar12[(long)(iVar14 + 6) + 2],*(undefined2 *)(puVar12 + (iVar14 + 6))) |
             0xff000000;
        tcu::RGBA::toVec((RGBA *)&local_290);
        local_238.m_data[0] =
             (float)(CONCAT12(puVar12[(long)(iVar14 + 9) + 2],
                              *(undefined2 *)(puVar12 + (iVar14 + 9))) | 0xff000000);
        tcu::RGBA::toVec((RGBA *)&local_238);
        local_298 = (ulong)(uint)((int)local_298 << 3);
        iVar14 = 0;
        do {
          fVar32 = ((float)iVar14 + 0.5) * 0.125;
          iVar26 = (int)local_298;
          iVar23 = 0;
          do {
            fVar33 = ((float)iVar23 + 0.5) * 0.125;
            bVar13 = 1.0 < fVar32 + fVar33;
            pTVar19 = &local_318;
            if (bVar13) {
              pTVar19 = &local_290;
            }
            fVar34 = fVar32;
            fVar35 = local_348._4_4_;
            RVar7.m_value = local_348._0_4_;
            fVar36 = uStack_340._4_4_;
            fVar37 = (float)uStack_340;
            RVar8.m_value = local_2f8._0_4_;
            fVar9 = local_2f8._4_4_;
            fVar10 = fStack_2f0;
            fVar11 = fStack_2ec;
            if (bVar13) {
              fVar33 = 1.0 - fVar33;
              fVar34 = 1.0 - fVar32;
              fVar35 = local_2f8._4_4_;
              RVar7.m_value = local_2f8._0_4_;
              fVar36 = fStack_2ec;
              fVar37 = fStack_2f0;
              RVar8.m_value = local_348._0_4_;
              fVar9 = local_348._4_4_;
              fVar10 = (float)uStack_340;
              fVar11 = uStack_340._4_4_;
            }
            fVar3 = (float)pTVar19->order;
            fVar4 = (float)pTVar19->type;
            fVar5 = (float)pTVar19[1].order;
            fVar6 = (float)pTVar19[1].type;
            local_238.m_data[0] =
                 fVar34 * ((float)RVar7.m_value - fVar3) +
                 fVar33 * ((float)RVar8.m_value - fVar3) + fVar3;
            local_238.m_data[1] = fVar34 * (fVar35 - fVar4) + fVar33 * (fVar9 - fVar4) + fVar4;
            local_238.m_data[2] = fVar34 * (fVar37 - fVar5) + fVar33 * (fVar10 - fVar5) + fVar5;
            local_238.m_data[3] = fVar34 * (fVar36 - fVar6) + fVar33 * (fVar11 - fVar6) + fVar6;
            tcu::PixelBufferAccess::setPixel
                      (local_1a8,&local_238,(int)((long)uVar2 % lVar27) * 8 + iVar23,iVar14 + iVar26
                       ,0);
            iVar23 = iVar23 + 1;
          } while (iVar23 != 8);
          iVar14 = iVar14 + 1;
        } while (iVar14 != 8);
        uVar28 = local_1b0 + 1;
      } while (uVar28 != local_1c0);
    }
    tcu::Surface::setSize(&local_1e0,local_264,local_260 << 3);
    this_00 = local_1c8;
    context = (this->super_BufferVerifierBase).m_renderCtx;
    local_318.order = RGBA;
    local_318.type = UNORM_INT8;
    pvVar31 = (void *)local_1e0.m_pixels.m_cap;
    if ((void *)local_1e0.m_pixels.m_cap != (void *)0x0) {
      pvVar31 = local_1e0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (local_1a8,&local_318,local_1e0.m_width,local_1e0.m_height,1,pvVar31);
    glu::readPixels(context,0,0,local_1a8);
    bVar13 = tcu::pixelThresholdCompare
                       ((this->super_BufferVerifierBase).m_log,"RenderResult",(char *)local_2c0,
                        &local_1f8,&local_1e0,&local_25c,COMPARE_LOG_RESULT);
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    iVar14 = (int)local_208 + iVar22;
  } while (bVar13);
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  tcu::Surface::~Surface(&local_1f8);
  tcu::Surface::~Surface(&local_1e0);
  if (local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2d8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return CONCAT31((int3)((uint)iVar22 >> 8),(int)local_2a0 <= iVar22);
}

Assistant:

bool VertexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_renderCtx.getRenderTarget();
	const int					numBytesInVtx		= 3;
	const int					numBytesInQuad		= numBytesInVtx*4;
	int							maxQuadsX			= de::min(128, renderTarget.getWidth()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsY			= de::min(128, renderTarget.getHeight()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsPerBatch	= maxQuadsX*maxQuadsY;
	int							numVerified			= 0;
	deUint32					program				= m_program->getProgram();
	tcu::RGBA					threshold			= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(3,3,3,3);
	bool						isOk				= true;

	vector<tcu::Vec2>			positions;
	vector<deUint16>			indices;

	tcu::Surface				rendered;
	tcu::Surface				reference;

	DE_ASSERT(numBytes >= numBytesInQuad); // Can't render full quad with smaller buffers.

	computePositions(positions, maxQuadsX, maxQuadsY);
	computeIndices(indices, maxQuadsX, maxQuadsY);

	// Reset buffer bindings.
	glBindBuffer				(GL_PIXEL_PACK_BUFFER, 0);

	// Setup rendering state.
	glViewport					(0, 0, maxQuadsX*VERIFY_QUAD_SIZE, maxQuadsY*VERIFY_QUAD_SIZE);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(program);
	glBindVertexArray			(m_vao);

	// Upload positions
	glBindBuffer				(GL_ARRAY_BUFFER, m_positionBuf);
	glBufferData				(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(positions.size()*sizeof(positions[0])), &positions[0], GL_STATIC_DRAW);
	glEnableVertexAttribArray	(m_posLoc);
	glVertexAttribPointer		(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

	// Upload indices
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER, m_indexBuf);
	glBufferData				(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indices.size()*sizeof(indices[0])), &indices[0], GL_STATIC_DRAW);

	glEnableVertexAttribArray	(m_byteVecLoc);
	glBindBuffer				(GL_ARRAY_BUFFER, buffer);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < numBytesInQuad;
		int		numBytesToVerify	= isLeftoverBatch ? numBytesInQuad				: de::min(maxQuadsPerBatch*numBytesInQuad, numRemaining - numRemaining%numBytesInQuad);
		int		curOffset			= isLeftoverBatch ? (numBytes-numBytesInQuad)	: numVerified;
		int		numQuads			= numBytesToVerify/numBytesInQuad;
		int		numCols				= de::min(maxQuadsX, numQuads);
		int		numRows				= numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0);
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		DE_ASSERT(numBytesToVerify > 0 && numBytesToVerify%numBytesInQuad == 0);
		DE_ASSERT(de::inBounds(curOffset, 0, numBytes));
		DE_ASSERT(de::inRange(curOffset+numBytesToVerify, curOffset, numBytes));

		// Render batch.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_byteVecLoc, 3, GL_UNSIGNED_BYTE, GL_TRUE, 0, (const glw::GLvoid*)(deUintptr)(offset + curOffset));
		glDrawElements			(GL_TRIANGLES, numQuads*6, GL_UNSIGNED_SHORT, DE_NULL);

		renderQuadGridReference(reference,  numQuads, numCols, refPtr + offset + curOffset);

		rendered.setSize(numCols*VERIFY_QUAD_SIZE, numRows*VERIFY_QUAD_SIZE);
		glu::readPixels(m_renderCtx, 0, 0, rendered.getAccess());

		if (!tcu::pixelThresholdCompare(m_log, "RenderResult", imageSetDesc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glBindVertexArray(0);

	return isOk;
}